

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfilesystem.cpp
# Opt level: O0

void __thiscall
sai::VirtualFileSystem::IterateFATBlock
          (VirtualFileSystem *this,size_t PageIndex,VirtualFileVisitor *Visitor)

{
  EntryType EVar1;
  iterator pvVar2;
  size_t sVar3;
  reference pvVar4;
  undefined1 local_20c4 [8];
  VirtualPage TablePage;
  weak_ptr<sai::ifstream> local_10b8;
  undefined1 local_10a8 [8];
  VirtualFileEntry CurEntry;
  FATEntry *CurFATEntry;
  iterator __end1;
  iterator __begin1;
  array<sai::FATEntry,_64UL> *__range1;
  VirtualPage CurPage;
  VirtualFileVisitor *Visitor_local;
  size_t PageIndex_local;
  VirtualFileSystem *this_local;
  
  CurPage.PageEntries._M_elems[0x1ff] = (PageEntry)Visitor;
  Visitor_local = (VirtualFileVisitor *)PageIndex;
  PageIndex_local = (size_t)this;
  memset(&__range1,0,0x1000);
  Read<sai::VirtualPage>(this,(long)Visitor_local << 0xc,(VirtualPage *)&__range1);
  __end1 = std::array<sai::FATEntry,_64UL>::begin((array<sai::FATEntry,_64UL> *)&__range1);
  pvVar2 = std::array<sai::FATEntry,_64UL>::end((array<sai::FATEntry,_64UL> *)&__range1);
  for (; (__end1 != pvVar2 && (CurEntry.PageOffset = (size_t)__end1, __end1->Flags != 0));
      __end1 = __end1 + 1) {
    std::weak_ptr<sai::ifstream>::weak_ptr<sai::ifstream,void>(&local_10b8,&this->FileStream);
    VirtualFileEntry::VirtualFileEntry
              ((VirtualFileEntry *)local_10a8,&local_10b8,(FATEntry *)CurEntry.PageOffset);
    std::weak_ptr<sai::ifstream>::~weak_ptr(&local_10b8);
    EVar1 = VirtualFileEntry::GetType((VirtualFileEntry *)local_10a8);
    if (EVar1 == Folder) {
      (**(code **)(*(long *)CurPage.PageEntries._M_elems[0x1ff] + 0x10))
                (CurPage.FATEntries._M_elems[0x3f].UnknownB,local_10a8);
      sVar3 = VirtualFileEntry::GetPageIndex((VirtualFileEntry *)local_10a8);
      IterateFATBlock(this,sVar3,(VirtualFileVisitor *)CurPage.PageEntries._M_elems[0x1ff]);
      (**(code **)(*(long *)CurPage.PageEntries._M_elems[0x1ff] + 0x18))();
    }
    VirtualFileEntry::~VirtualFileEntry((VirtualFileEntry *)local_10a8);
  }
  memset(local_20c4,0,0x1000);
  sVar3 = VirtualPage::NearestTableIndex((size_t)Visitor_local);
  Read<sai::VirtualPage>(this,sVar3 << 0xc,(VirtualPage *)local_20c4);
  pvVar4 = std::array<sai::VirtualPage::PageEntry,_512UL>::operator[]
                     ((array<sai::VirtualPage::PageEntry,_512UL> *)local_20c4,
                      (ulong)Visitor_local & 0x1ff);
  if (pvVar4->NextPageIndex != 0) {
    pvVar4 = std::array<sai::VirtualPage::PageEntry,_512UL>::operator[]
                       ((array<sai::VirtualPage::PageEntry,_512UL> *)local_20c4,
                        (ulong)Visitor_local & 0x1ff);
    IterateFATBlock(this,(ulong)pvVar4->NextPageIndex,
                    (VirtualFileVisitor *)CurPage.PageEntries._M_elems[0x1ff]);
  }
  return;
}

Assistant:

void VirtualFileSystem::IterateFATBlock(std::size_t PageIndex, VirtualFileVisitor& Visitor)
{
	VirtualPage CurPage = {};
	Read(PageIndex * VirtualPage::PageSize, CurPage);

	for( const FATEntry& CurFATEntry : CurPage.FATEntries )
	{
		if( !CurFATEntry.Flags )
		{
			break;
		}

		VirtualFileEntry CurEntry(FileStream, CurFATEntry);
		switch( CurEntry.GetType() )
		{
		case FATEntry::EntryType::File:
		{
			Visitor.VisitFile(CurEntry);
			break;
		}
		case FATEntry::EntryType::Folder:
		{
			Visitor.VisitFolderBegin(CurEntry);
			IterateFATBlock(CurEntry.GetPageIndex(), Visitor);
			Visitor.VisitFolderEnd(CurEntry);
			break;
		}
		}
	}

	VirtualPage TablePage = {};
	Read(VirtualPage::NearestTableIndex(PageIndex) * VirtualPage::PageSize, TablePage);

	if( TablePage.PageEntries[PageIndex % VirtualPage::TableSpan].NextPageIndex )
	{
		IterateFATBlock(
			TablePage.PageEntries[PageIndex % VirtualPage::TableSpan].NextPageIndex, Visitor
		);
	}
}